

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O3

DecodeStatus DecodeMoveImmInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint uVar1;
  uint *puVar2;
  MCOperand *Op;
  
  uVar1 = MCInst_getOpcode(Inst);
  if (5 < uVar1 - 0x452) {
    return MCDisassembler_Fail;
  }
  if ((0x15U >> (uVar1 - 0x452 & 0x1f) & 1) == 0) {
    puVar2 = GPR64DecoderTable;
  }
  else {
    if ((insn >> 0x16 & 1) != 0) {
      return MCDisassembler_Fail;
    }
    puVar2 = GPR32DecoderTable;
  }
  MCOperand_CreateReg0(Inst,puVar2[insn & 0x1f]);
  uVar1 = MCInst_getOpcode(Inst);
  if ((uVar1 == 0x452) || (uVar1 = MCInst_getOpcode(Inst), uVar1 == 0x453)) {
    Op = MCInst_getOperand(Inst,0);
    MCInst_addOperand2(Inst,Op);
  }
  MCOperand_CreateImm0(Inst,(ulong)(insn >> 5) & 0xffff);
  MCOperand_CreateImm0(Inst,(ulong)(insn >> 0x11 & 0x30));
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeMoveImmInstruction(MCInst *Inst, uint32_t insn,
		uint64_t Addr,
		void *Decoder)
{
	unsigned Rd = fieldFromInstruction(insn, 0, 5);
	unsigned imm = fieldFromInstruction(insn, 5, 16);
	unsigned shift = fieldFromInstruction(insn, 21, 2);

	shift <<= 4;

	switch (MCInst_getOpcode(Inst)) {
		default:
			return Fail;
		case AArch64_MOVZWi:
		case AArch64_MOVNWi:
		case AArch64_MOVKWi:
			if (shift & (1U << 5))
				return Fail;
			DecodeGPR32RegisterClass(Inst, Rd, Addr, Decoder);
			break;
		case AArch64_MOVZXi:
		case AArch64_MOVNXi:
		case AArch64_MOVKXi:
			DecodeGPR64RegisterClass(Inst, Rd, Addr, Decoder);
			break;
	}

	if (MCInst_getOpcode(Inst) == AArch64_MOVKWi ||
			MCInst_getOpcode(Inst) == AArch64_MOVKXi)
		MCInst_addOperand2(Inst, MCInst_getOperand(Inst, 0));

	MCOperand_CreateImm0(Inst, imm);
	MCOperand_CreateImm0(Inst, shift);
	return Success;
}